

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particle_decay.cpp
# Opt level: O2

void __thiscall
particle_decay::perform_decays
          (particle_decay *this,particle_info *mother,
          vector<particle_info,_std::allocator<particle_info>_> *daughter_list)

{
  int iVar1;
  int POI_monval;
  iterator iVar2;
  mapped_type *pmVar3;
  ostream *poVar4;
  pointer paVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  particle_info daughter1;
  particle_info daughter2;
  particle_decay_info mother_decay_info;
  particle_info daughter3;
  particle_info local_210;
  particle_info local_198;
  anon_struct_128_15_51aee7c3_for_second local_120;
  particle_info local_a0;
  
  local_120.name._M_dataplus._M_p = (pointer)&local_120.name.field_2;
  local_120.name._M_string_length = 0;
  local_120.name.field_2._M_local_buf[0] = '\0';
  local_120.decay_channels.
  super__Vector_base<decay_channel_info,_std::allocator<decay_channel_info>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_120.decay_channels.
  super__Vector_base<decay_channel_info,_std::allocator<decay_channel_info>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_120.decay_channels.
  super__Vector_base<decay_channel_info,_std::allocator<decay_channel_info>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar2 = std::
          _Rb_tree<int,_std::pair<const_int,_particle_decay_info>,_std::_Select1st<std::pair<const_int,_particle_decay_info>_>,_std::less<int>,_std::allocator<std::pair<const_int,_particle_decay_info>_>_>
          ::find((_Rb_tree<int,_std::pair<const_int,_particle_decay_info>,_std::_Select1st<std::pair<const_int,_particle_decay_info>_>,_std::less<int>,_std::allocator<std::pair<const_int,_particle_decay_info>_>_>
                  *)this,&mother->monval);
  if ((_Rb_tree_header *)iVar2._M_node ==
      &(this->resonance_table_)._M_t._M_impl.super__Rb_tree_header) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Warning: pdg ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,mother->monval);
    poVar4 = std::operator<<(poVar4," not found, might be some table inconsistency");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  else {
    pmVar3 = std::
             map<int,_particle_decay_info,_std::less<int>,_std::allocator<std::pair<const_int,_particle_decay_info>_>_>
             ::operator[](&this->resonance_table_,&mother->monval);
    std::pair<const_int,_particle_decay_info>::anon_struct_128_15_51aee7c3_for_second::operator=
              (&local_120,pmVar3);
    if (local_120.stable == 1) {
      std::vector<particle_info,_std::allocator<particle_info>_>::push_back(daughter_list,mother);
    }
    else {
      dVar7 = RandomUtil::Random::rand_uniform
                        ((this->ran_gen_ptr_).
                         super___shared_ptr<RandomUtil::Random,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      if (local_120.decays < 1) {
        local_120.decays = 0;
      }
      lVar6 = (ulong)(uint)local_120.decays + 1;
      paVar5 = local_120.decay_channels.
               super__Vector_base<decay_channel_info,_std::allocator<decay_channel_info>_>._M_impl.
               super__Vector_impl_data._M_start + -1;
      dVar8 = 0.0;
      do {
        lVar6 = lVar6 + -1;
        if (lVar6 == 0) {
          paVar5 = (pointer)0x0;
          break;
        }
        dVar8 = dVar8 + paVar5[1].branching_ratio;
        paVar5 = paVar5 + 1;
      } while (dVar8 <= dVar7);
      if (paVar5->decay_Npart == 3) {
        local_210.monval = paVar5->decay_part[0];
        iVar1 = paVar5->decay_part[1];
        POI_monval = paVar5->decay_part[2];
        local_198.monval = iVar1;
        local_a0.monval = POI_monval;
        local_210.mass = get_particle_mass(this,local_210.monval);
        local_198.mass = get_particle_mass(this,iVar1);
        local_a0.mass = get_particle_mass(this,POI_monval);
        perform_three_body_decay(this,mother,&local_210,&local_198,&local_a0);
        std::vector<particle_info,_std::allocator<particle_info>_>::push_back
                  (daughter_list,&local_210);
        std::vector<particle_info,_std::allocator<particle_info>_>::push_back
                  (daughter_list,&local_198);
        std::vector<particle_info,_std::allocator<particle_info>_>::push_back
                  (daughter_list,&local_a0);
      }
      else if (paVar5->decay_Npart == 2) {
        local_210.monval = paVar5->decay_part[0];
        iVar1 = paVar5->decay_part[1];
        local_198.monval = iVar1;
        local_210.mass = get_particle_mass(this,local_210.monval);
        local_198.mass = get_particle_mass(this,iVar1);
        perform_two_body_decay(this,mother,&local_210,&local_198);
        std::vector<particle_info,_std::allocator<particle_info>_>::push_back
                  (daughter_list,&local_210);
        std::vector<particle_info,_std::allocator<particle_info>_>::push_back
                  (daughter_list,&local_198);
      }
    }
  }
  std::pair<const_int,_particle_decay_info>::anon_struct_128_15_51aee7c3_for_second::
  ~particle_decay_info(&local_120);
  return;
}

Assistant:

void particle_decay::perform_decays(
    particle_info &mother, std::vector<particle_info> &daughter_list) {
    particle_decay_info mother_decay_info;
    if (resonance_table_.find(mother.monval) == resonance_table_.end()) {
        std::cout << "Warning: pdg " << mother.monval
                  << " not found, might be some table inconsistency"
                  << std::endl;
        return;
    } else {
        mother_decay_info = resonance_table_[mother.monval];
    }
    if (mother_decay_info.stable == 1) {
        // the particle is a stable particle
        daughter_list.push_back(mother);
        return;
    }
    // std::cout << "Decaying " << mother_decay_info->name
    //           << "(" << mother_decay_info->monval << ") ..." << std::endl;
    int N_decay_channel = mother_decay_info.decays;
    double random_local = ran_gen_ptr_->rand_uniform();
    double cumulated_branching_ratio = 0.0;
    decay_channel_info *picked_channel = NULL;
    for (int i_channel = 0; i_channel < N_decay_channel; i_channel++) {
        cumulated_branching_ratio +=
            mother_decay_info.decay_channels[i_channel].branching_ratio;
        if (cumulated_branching_ratio > random_local) {
            picked_channel = &mother_decay_info.decay_channels[i_channel];
            break;
        }
    }
    int N_decay_part = picked_channel->decay_Npart;
    if (N_decay_part == 2) {
        particle_info daughter1;
        particle_info daughter2;
        int decay_part1_monval = picked_channel->decay_part[0];
        int decay_part2_monval = picked_channel->decay_part[1];
        daughter1.monval = decay_part1_monval;
        daughter2.monval = decay_part2_monval;
        daughter1.mass = get_particle_mass(decay_part1_monval);
        daughter2.mass = get_particle_mass(decay_part2_monval);
        perform_two_body_decay(mother, daughter1, daughter2);
        daughter_list.push_back(daughter1);
        daughter_list.push_back(daughter2);
    } else if (N_decay_part == 3) {
        particle_info daughter1;
        particle_info daughter2;
        particle_info daughter3;
        int decay_part1_monval = picked_channel->decay_part[0];
        int decay_part2_monval = picked_channel->decay_part[1];
        int decay_part3_monval = picked_channel->decay_part[2];
        daughter1.monval = decay_part1_monval;
        daughter2.monval = decay_part2_monval;
        daughter3.monval = decay_part3_monval;
        daughter1.mass = get_particle_mass(decay_part1_monval);
        daughter2.mass = get_particle_mass(decay_part2_monval);
        daughter3.mass = get_particle_mass(decay_part3_monval);
        perform_three_body_decay(mother, daughter1, daughter2, daughter3);
        daughter_list.push_back(daughter1);
        daughter_list.push_back(daughter2);
        daughter_list.push_back(daughter3);
    }
}